

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ConversionStream
          (ConversionStream *this,IReferenceCounters *pRefCounters,HLSL2GLSLConverterImpl *Converter
          ,char *InputFileName,IShaderSourceInputStreamFactory *pInputStreamFactory,Char *HLSLSource
          ,size_t NumSymbols,bool bPreserveTokens)

{
  RefCntAutoPtr<Diligent::DataBlobImpl> *AutoPtr;
  char *pcVar1;
  Char *pCVar2;
  IShaderSourceInputStreamFactory *pIVar3;
  int iVar4;
  IFileStream **ppIVar5;
  IFileStream *pIVar6;
  IDataBlob *pIVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IShaderSourceInputStreamFactory *local_f0;
  TokenListType local_b8;
  allocator local_99;
  undefined1 local_98 [8];
  String Source;
  RefCntAutoPtr<Diligent::IFileStream> local_60;
  RefCntAutoPtr<Diligent::IFileStream> pSourceStream;
  RefCntAutoPtr<Diligent::IDataBlob> pFileData;
  allocator local_3a;
  byte local_39;
  Char *pCStack_38;
  bool bPreserveTokens_local;
  Char *HLSLSource_local;
  IShaderSourceInputStreamFactory *pInputStreamFactory_local;
  char *InputFileName_local;
  HLSL2GLSLConverterImpl *Converter_local;
  IReferenceCounters *pRefCounters_local;
  ConversionStream *this_local;
  
  local_39 = bPreserveTokens;
  pCStack_38 = HLSLSource;
  HLSLSource_local = (Char *)pInputStreamFactory;
  pInputStreamFactory_local = (IShaderSourceInputStreamFactory *)InputFileName;
  InputFileName_local = (char *)Converter;
  Converter_local = (HLSL2GLSLConverterImpl *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  ObjectBase<Diligent::IHLSL2GLSLConversionStream>::ObjectBase
            (&this->super_ObjectBase<Diligent::IHLSL2GLSLConversionStream>,pRefCounters);
  (this->super_ObjectBase<Diligent::IHLSL2GLSLConversionStream>).
  super_RefCountedObject<Diligent::IHLSL2GLSLConversionStream>.super_IHLSL2GLSLConversionStream.
  super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00594070;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::list
            (&this->m_Tokens);
  std::
  unordered_map<Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>_>_>
  ::unordered_map(&this->m_StructDefinitions);
  std::
  unordered_map<Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>_>_>
  ::unordered_map(&this->m_PreprocessorDefinitions);
  std::
  vector<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType>_>
  ::vector(&this->m_Objects);
  this->m_bPreserveTokens = (bool)(local_39 & 1);
  this->m_bUseInOutLocationQualifiers = true;
  this->m_bUseRowMajorMatrices = false;
  this->m_Converter = (HLSL2GLSLConverterImpl *)InputFileName_local;
  if (pInputStreamFactory_local == (IShaderSourceInputStreamFactory *)0x0) {
    local_f0 = (IShaderSourceInputStreamFactory *)0x475099;
  }
  else {
    local_f0 = pInputStreamFactory_local;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_InputFileName,(char *)local_f0,&local_3a);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a);
  RefCntAutoPtr<Diligent::IDataBlob>::RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::IDataBlob> *)&pSourceStream);
  if (pCStack_38 == (Char *)0x0) {
    if (pInputStreamFactory_local == (IShaderSourceInputStreamFactory *)0x0) {
      LogError<true,char[71]>
                (false,"ConversionStream",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x1157,(char (*) [71])
                         "Input file name must not be null when HLSL source code is not provided");
    }
    if (HLSLSource_local == (Char *)0x0) {
      LogError<true,char[76]>
                (false,"ConversionStream",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x115a,(char (*) [76])
                         "Input stream factory must not be null when HLSL source code is not provided"
                );
    }
    RefCntAutoPtr<Diligent::IFileStream>::RefCntAutoPtr(&local_60);
    pIVar3 = pInputStreamFactory_local;
    pCVar2 = HLSLSource_local;
    RefCntAutoPtr<Diligent::IFileStream>::operator&
              ((RefCntAutoPtr<Diligent::IFileStream> *)&stack0xffffffffffffff90);
    ppIVar5 = Diligent::RefCntAutoPtr::DoublePtrHelper::operator_cast_to_IFileStream__
                        ((DoublePtrHelper *)&stack0xffffffffffffff90);
    (**(code **)(*(long *)pCVar2 + 0x20))(pCVar2,pIVar3,ppIVar5);
    RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::~DoublePtrHelper
              ((DoublePtrHelper<Diligent::IFileStream> *)&stack0xffffffffffffff90);
    pIVar6 = Diligent::RefCntAutoPtr::operator_cast_to_IFileStream_((RefCntAutoPtr *)&local_60);
    if (pIVar6 == (IFileStream *)0x0) {
      LogError<true,char[35],char_const*>
                (false,"ConversionStream",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x115f,(char (*) [35])"Failed to open shader source file ",
                 (char **)&pInputStreamFactory_local);
    }
    DataBlobImpl::Create((DataBlobImpl *)((long)&Source.field_2 + 8),0,(void *)0x0);
    AutoPtr = (RefCntAutoPtr<Diligent::DataBlobImpl> *)((long)&Source.field_2 + 8);
    RefCntAutoPtr<Diligent::IDataBlob>::operator=
              ((RefCntAutoPtr<Diligent::IDataBlob> *)&pSourceStream,AutoPtr);
    RefCntAutoPtr<Diligent::DataBlobImpl>::~RefCntAutoPtr(AutoPtr);
    pIVar6 = RefCntAutoPtr<Diligent::IFileStream>::operator->(&local_60);
    pIVar7 = Diligent::RefCntAutoPtr::operator_cast_to_IDataBlob_((RefCntAutoPtr *)&pSourceStream);
    (*(pIVar6->super_IObject)._vptr_IObject[5])(pIVar6,pIVar7);
    pIVar7 = RefCntAutoPtr<Diligent::IDataBlob>::operator->
                       ((RefCntAutoPtr<Diligent::IDataBlob> *)&pSourceStream);
    iVar4 = (*(pIVar7->super_IObject)._vptr_IObject[6])(pIVar7,0);
    pCStack_38 = (Char *)CONCAT44(extraout_var,iVar4);
    pIVar7 = RefCntAutoPtr<Diligent::IDataBlob>::operator->
                       ((RefCntAutoPtr<Diligent::IDataBlob> *)&pSourceStream);
    iVar4 = (*(pIVar7->super_IObject)._vptr_IObject[5])();
    NumSymbols = CONCAT44(extraout_var_00,iVar4);
    RefCntAutoPtr<Diligent::IFileStream>::~RefCntAutoPtr(&local_60);
  }
  pcVar1 = pCStack_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_98,pcVar1,NumSymbols,&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  InsertIncludes(this,(String *)local_98,(IShaderSourceInputStreamFactory *)HLSLSource_local);
  Parsing::HLSLTokenizer::Tokenize(&local_b8,&this->m_Converter->m_HLSLTokenizer,(String *)local_98)
  ;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  operator=(&this->m_Tokens,&local_b8);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::~list
            (&local_b8);
  std::__cxx11::string::~string((string *)local_98);
  RefCntAutoPtr<Diligent::IDataBlob>::~RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::IDataBlob> *)&pSourceStream);
  return;
}

Assistant:

HLSL2GLSLConverterImpl::ConversionStream::ConversionStream(IReferenceCounters*              pRefCounters,
                                                           const HLSL2GLSLConverterImpl&    Converter,
                                                           const char*                      InputFileName,
                                                           IShaderSourceInputStreamFactory* pInputStreamFactory,
                                                           const Char*                      HLSLSource,
                                                           size_t                           NumSymbols,
                                                           bool                             bPreserveTokens) :
    // clang-format off
    TBase            {pRefCounters   },
    m_bPreserveTokens{bPreserveTokens},
    m_Converter      {Converter      },
    m_InputFileName  {InputFileName != nullptr ? InputFileName : "<Unknown>"}
// clang-format on
{
    RefCntAutoPtr<IDataBlob> pFileData;
    if (HLSLSource == nullptr)
    {
        if (InputFileName == nullptr)
            LOG_ERROR_AND_THROW("Input file name must not be null when HLSL source code is not provided");

        if (pInputStreamFactory == nullptr)
            LOG_ERROR_AND_THROW("Input stream factory must not be null when HLSL source code is not provided");

        RefCntAutoPtr<IFileStream> pSourceStream;
        pInputStreamFactory->CreateInputStream(InputFileName, &pSourceStream);
        if (pSourceStream == nullptr)
            LOG_ERROR_AND_THROW("Failed to open shader source file ", InputFileName);

        pFileData = DataBlobImpl::Create();
        pSourceStream->ReadBlob(pFileData);
        HLSLSource = reinterpret_cast<char*>(pFileData->GetDataPtr());
        NumSymbols = pFileData->GetSize();
    }

    String Source(HLSLSource, NumSymbols);

    InsertIncludes(Source, pInputStreamFactory);

    m_Tokens = m_Converter.m_HLSLTokenizer.Tokenize(Source);
}